

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O0

int template_find_field(t_template *x,t_symbol *name,int *p_onset,int *p_type,t_symbol **p_arraytype
                       )

{
  int local_44;
  int n;
  int i;
  t_template *t;
  t_symbol **p_arraytype_local;
  int *p_type_local;
  int *p_onset_local;
  t_symbol *name_local;
  t_template *x_local;
  
  if (x == (t_template *)0x0) {
    bug("template_find_field");
  }
  else {
    for (local_44 = 0; local_44 < x->t_n; local_44 = local_44 + 1) {
      if (x->t_vec[local_44].ds_name == name) {
        *p_onset = local_44 << 3;
        *p_type = x->t_vec[local_44].ds_type;
        *p_arraytype = x->t_vec[local_44].ds_arraytemplate;
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

int template_find_field(t_template *x, t_symbol *name, int *p_onset,
    int *p_type, t_symbol **p_arraytype)
{
    t_template *t;
    int i, n;
    if (!x)
    {
        bug("template_find_field");
        return (0);
    }
    n = x->t_n;
    for (i = 0; i < n; i++)
        if (x->t_vec[i].ds_name == name)
    {
        *p_onset = i * sizeof(t_word);
        *p_type = x->t_vec[i].ds_type;
        *p_arraytype = x->t_vec[i].ds_arraytemplate;
        return (1);
    }
    return (0);
}